

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O0

time_point __thiscall
spdlog::sinks::daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator>::
next_rotation_tp_(daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *this)

{
  bool bVar1;
  time_point tVar2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDI;
  time_point rotation_time;
  tm date;
  time_point now;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int iVar3;
  daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *in_stack_ffffffffffffff98;
  time_point in_stack_ffffffffffffffa0;
  tm local_50;
  undefined8 local_18;
  duration local_8;
  
  local_18 = std::chrono::_V2::system_clock::now();
  now_tm(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  local_50.tm_hour = (int)in_RDI[0xc].__d.__r;
  local_50.tm_min = *(int *)((long)&in_RDI[0xc].__d.__r + 4);
  local_50.tm_sec = 0;
  mktime(&local_50);
  tVar2 = std::chrono::_V2::system_clock::from_time_t((time_t)in_stack_ffffffffffffff98);
  bVar1 = std::chrono::operator>
                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI);
  local_8 = tVar2.__d.__r;
  if (!bVar1) {
    iVar3 = 0x18;
    std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>
              ((duration<long,std::ratio<3600l,1l>> *)&stack0xffffffffffffff98,
               (int *)&stack0xffffffffffffff94);
    local_8.__r = (rep)std::chrono::operator+
                                 ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                   *)in_stack_ffffffffffffff98,
                                  (duration<long,_std::ratio<3600L,_1L>_> *)
                                  CONCAT44(iVar3,in_stack_ffffffffffffff90));
  }
  return (time_point)(duration)local_8.__r;
}

Assistant:

log_clock::time_point next_rotation_tp_()
    {
        auto now = log_clock::now();
        tm date = now_tm(now);
        date.tm_hour = rotation_h_;
        date.tm_min = rotation_m_;
        date.tm_sec = 0;
        auto rotation_time = log_clock::from_time_t(std::mktime(&date));
        if (rotation_time > now)
        {
            return rotation_time;
        }
        return {rotation_time + std::chrono::hours(24)};
    }